

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::createShard<std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>
          (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *container,
          size_t shardCount,size_t shardIndex)

{
  long lVar1;
  unsigned_long *puVar2;
  unsigned_long in_RCX;
  ulong in_RDX;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_RSI;
  allocator_type *in_RDI;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  endIterator;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  startIterator;
  size_t endIndex;
  size_t startIndex;
  size_t leftoverTests;
  size_t shardSize;
  size_t totalTestCount;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  in_stack_ffffffffffffff28;
  allocator_type *this;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<const_Catch::TestCaseHandle_*,_std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>_>
  in_stack_ffffffffffffff70;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_stack_ffffffffffffff78;
  vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *in_stack_ffffffffffffff80;
  unsigned_long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  ulong local_30;
  size_type local_28;
  unsigned_long local_20;
  ulong local_18;
  
  if (in_RDX == 1) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this = in_RDI;
  }
  else {
    this = in_RDI;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_28 = std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::size
                         (in_RSI);
    local_30 = local_28 / local_18;
    local_38 = local_28 % local_18;
    lVar1 = local_20 * local_30;
    puVar2 = std::min<unsigned_long>(&local_20,&local_38);
    local_40 = lVar1 + *puVar2;
    local_50 = local_20 + 1;
    lVar1 = local_50 * local_30;
    puVar2 = std::min<unsigned_long>(&local_50,&local_38);
    local_48 = lVar1 + *puVar2;
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
              ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
               in_stack_ffffffffffffff28._M_current);
    std::
    next<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>>
              (in_stack_ffffffffffffff28,0x1d3069);
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::begin
              ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)
               in_stack_ffffffffffffff28._M_current);
    std::
    next<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>>
              (in_stack_ffffffffffffff28,0x1d3095);
    std::allocator<Catch::TestCaseHandle>::allocator((allocator<Catch::TestCaseHandle> *)0x1d30c0);
    std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>::
    vector<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle_const*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,void>
              ((vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)this,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_RDI);
    std::allocator<Catch::TestCaseHandle>::~allocator((allocator<Catch::TestCaseHandle> *)0x1d30e5);
  }
  return (vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *)this;
}

Assistant:

Container createShard(Container const& container, std::size_t const shardCount, std::size_t const shardIndex) {
        assert(shardCount > shardIndex);

        if (shardCount == 1) {
            return container;
        }

        const std::size_t totalTestCount = container.size();

        const std::size_t shardSize = totalTestCount / shardCount;
        const std::size_t leftoverTests = totalTestCount % shardCount;

        const std::size_t startIndex = shardIndex * shardSize + (std::min)(shardIndex, leftoverTests);
        const std::size_t endIndex = (shardIndex + 1) * shardSize + (std::min)(shardIndex + 1, leftoverTests);

        auto startIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(startIndex));
        auto endIterator = std::next(container.begin(), static_cast<std::ptrdiff_t>(endIndex));

        return Container(startIterator, endIterator);
    }